

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::onIdleRun(KCPServer *this)

{
  ServerStage SVar1;
  bool bVar2;
  reference ppVar3;
  pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData> *it;
  iterator __end3;
  iterator __begin3;
  map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
  *__range3;
  KCPServer *this_local;
  
  (*(this->super_Server).super_Runnable._vptr_Runnable[0x11])();
  SVar1 = (this->super_Server).m_serverStage;
  if (SVar1 == CLEAR) {
    __end3 = std::
             map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
             ::begin(&this->m_allSession);
    it = (pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData> *)
         std::
         map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
         ::end(&this->m_allSession);
    while (bVar2 = std::operator!=(&__end3,(_Self *)&it), bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
               ::operator*(&__end3);
      if (((ppVar3->second).isInvalid & 1U) == 0) {
        (*(((ppVar3->second).session)->super_Session)._vptr_Session[9])();
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>::
      operator++(&__end3);
    }
    (this->super_Server).m_serverStage = WAIT_SESSION_CLOSE;
  }
  else if ((SVar1 == WAIT_SESSION_CLOSE) &&
          (bVar2 = std::
                   map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                   ::empty(&this->m_allSession), bVar2)) {
    (**(this->m_server->super_Socket)._vptr_Socket)();
    free(this->m_server);
    this->m_server = (KCPSocket *)0x0;
    Runnable::stopIdle((Runnable *)this);
    UVLoop::stop(&(this->super_Server).super_Runnable.m_loop);
  }
  return;
}

Assistant:

void KCPServer::onIdleRun()
{
	executeOperation();

	switch (m_serverStage)
	{
	case ServerStage::CLEAR:
	{
		for (auto& it : m_allSession)
		{
			if (!it.second.isInvalid)
			{
				it.second.session->executeDisconnect();
			}
		}
		m_serverStage = ServerStage::WAIT_SESSION_CLOSE;
	}
	break;
	case ServerStage::WAIT_SESSION_CLOSE:
	{
		if (m_allSession.empty())
		{
			m_server->~KCPSocket();
			fc_free(m_server);
			m_server = NULL;

			stopIdle();
			m_loop.stop();
		}
	}
	break;
	default:
		break;
	}
}